

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O1

int yaml_parser_fetch_document_indicator(yaml_parser_t *parser,yaml_token_type_t type)

{
  yaml_token_t **tail;
  byte *pbVar1;
  byte bVar2;
  yaml_simple_key_t *pyVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  byte *pbVar7;
  size_t sVar8;
  yaml_token_t *pyVar9;
  size_t sVar10;
  size_t sVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  yaml_mark_t start_mark;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  
  iVar12 = yaml_parser_unroll_indent(parser,-1);
  iVar13 = 0;
  if (iVar12 != 0) {
    pyVar3 = (parser->simple_keys).top;
    if ((pyVar3[-1].possible == 0) || (pyVar3[-1].required == 0)) {
      pyVar3[-1].possible = 0;
      parser->simple_key_allowed = 0;
      sVar4 = (parser->mark).column;
      sVar10 = (parser->mark).index;
      sVar11 = (parser->mark).line;
      sVar5 = (parser->mark).index;
      (parser->mark).index = sVar5 + 1;
      sVar6 = (parser->mark).column;
      (parser->mark).column = sVar6 + 1;
      pbVar7 = (parser->buffer).pointer;
      sVar8 = parser->unread;
      parser->unread = sVar8 - 1;
      bVar2 = *pbVar7;
      lVar14 = 1;
      lVar15 = 1;
      if (((char)bVar2 < '\0') &&
         ((lVar15 = 2, (bVar2 & 0xe0) != 0xc0 && (lVar15 = 3, (bVar2 & 0xf0) != 0xe0)))) {
        lVar15 = (ulong)((bVar2 & 0xf8) == 0xf0) << 2;
      }
      pbVar1 = pbVar7 + lVar15;
      (parser->buffer).pointer = pbVar1;
      (parser->mark).index = sVar5 + 2;
      (parser->mark).column = sVar6 + 2;
      parser->unread = sVar8 - 2;
      bVar2 = pbVar7[lVar15];
      if ((((char)bVar2 < '\0') && (lVar14 = 2, (bVar2 & 0xe0) != 0xc0)) &&
         (lVar14 = 3, (bVar2 & 0xf0) != 0xe0)) {
        lVar14 = (ulong)((bVar2 & 0xf8) == 0xf0) << 2;
      }
      (parser->buffer).pointer = pbVar1 + lVar14;
      (parser->mark).index = sVar5 + 3;
      (parser->mark).column = sVar6 + 3;
      parser->unread = sVar8 - 3;
      bVar2 = pbVar1[lVar14];
      lVar15 = 1;
      if ((((char)bVar2 < '\0') && (lVar15 = 2, (bVar2 & 0xe0) != 0xc0)) &&
         (lVar15 = 3, (bVar2 & 0xf0) != 0xe0)) {
        lVar15 = (ulong)((bVar2 & 0xf8) == 0xf0) << 2;
      }
      (parser->buffer).pointer = pbVar1 + lVar14 + lVar15;
      sVar5 = (parser->mark).column;
      sVar6 = (parser->mark).index;
      sVar8 = (parser->mark).line;
      uStack_6c = (undefined4)sVar4;
      uStack_68 = (undefined4)(sVar4 >> 0x20);
      local_78 = (undefined4)(sVar10 >> 0x20);
      uStack_74 = (undefined4)sVar11;
      uStack_70 = (undefined4)(sVar11 >> 0x20);
      tail = &(parser->tokens).tail;
      if (((parser->tokens).tail == (parser->tokens).end) &&
         (iVar12 = yaml_queue_extend(&(parser->tokens).start,&(parser->tokens).head,tail,
                                     &(parser->tokens).end), iVar12 == 0)) {
        parser->error = YAML_MEMORY_ERROR;
        return 0;
      }
      pyVar9 = *tail;
      *tail = pyVar9 + 1;
      pyVar9->type = type;
      *(undefined8 *)&pyVar9->field_0x4 = 0;
      *(undefined8 *)((long)&(pyVar9->data).alias.value + 4) = 0;
      *(undefined8 *)((long)&(pyVar9->data).tag.suffix + 4) = 0;
      *(size_t *)((long)&pyVar9->data + 0x14) = sVar10 << 0x20;
      *(ulong *)((long)&(pyVar9->start_mark).index + 4) = CONCAT44(uStack_74,local_78);
      *(ulong *)((long)&(pyVar9->start_mark).line + 4) = CONCAT44(uStack_6c,uStack_70);
      *(undefined4 *)((long)&(pyVar9->start_mark).column + 4) = uStack_68;
      (pyVar9->end_mark).index = sVar6;
      (pyVar9->end_mark).line = sVar8;
      (pyVar9->end_mark).column = sVar5;
      iVar13 = 1;
    }
    else {
      sVar4 = pyVar3[-1].mark.column;
      sVar5 = pyVar3[-1].mark.index;
      sVar6 = pyVar3[-1].mark.line;
      parser->error = YAML_SCANNER_ERROR;
      parser->context = "while scanning a simple key";
      (parser->context_mark).index = sVar5;
      (parser->context_mark).line = sVar6;
      (parser->context_mark).column = sVar4;
      parser->problem = "could not find expected \':\'";
      sVar4 = (parser->mark).line;
      (parser->problem_mark).index = (parser->mark).index;
      (parser->problem_mark).line = sVar4;
      (parser->problem_mark).column = (parser->mark).column;
    }
  }
  return iVar13;
}

Assistant:

static int
yaml_parser_fetch_document_indicator(yaml_parser_t *parser,
        yaml_token_type_t type)
{
    yaml_mark_t start_mark, end_mark;
    yaml_token_t token;

    /* Reset the indentation level. */

    if (!yaml_parser_unroll_indent(parser, -1))
        return 0;

    /* Reset simple keys. */

    if (!yaml_parser_remove_simple_key(parser))
        return 0;

    parser->simple_key_allowed = 0;

    /* Consume the token. */

    start_mark = parser->mark;

    SKIP(parser);
    SKIP(parser);
    SKIP(parser);

    end_mark = parser->mark;

    /* Create the DOCUMENT-START or DOCUMENT-END token. */

    TOKEN_INIT(token, type, start_mark, end_mark);

    /* Append the token to the queue. */

    if (!ENQUEUE(parser, parser->tokens, token))
        return 0;

    return 1;
}